

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall vm::VM::DUP2(VM *this)

{
  int iVar1;
  type piVar2;
  VM *this_local;
  
  ensureStackUsed(this,2);
  ensureStackRest(this,2);
  piVar2 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     (&this->_stack,(long)(this->_sp + -2));
  iVar1 = *piVar2;
  piVar2 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     (&this->_stack,(long)this->_sp);
  *piVar2 = iVar1;
  piVar2 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     (&this->_stack,(long)(this->_sp + -1));
  iVar1 = *piVar2;
  piVar2 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     (&this->_stack,(long)(this->_sp + 1));
  *piVar2 = iVar1;
  this->_sp = this->_sp + 2;
  return;
}

Assistant:

void VM::DUP2() {
    ensureStackUsed(2);
    ensureStackRest(2);
    _stack[_sp] = _stack[_sp-2];
    _stack[_sp+1] = _stack[_sp-1];
    _sp += 2;
}